

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_2,_2> *value)

{
  int ndx;
  long lVar1;
  Vector<tcu::Interval,_2> *pVVar2;
  Vector<float,_2> local_68;
  IVal local_60;
  
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  lVar1 = 0;
  pVVar2 = (Vector<tcu::Interval,_2> *)__return_storage_ptr__;
  do {
    local_68.m_data = *&(value->m_data).m_data[lVar1].m_data;
    ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
              (&local_60,fmt,&local_68);
    ((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[1].m_lo =
         local_60.m_data[1].m_lo;
    ((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[1].m_hi =
         local_60.m_data[1].m_hi;
    ((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[0].m_hi =
         local_60.m_data[0].m_hi;
    ((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[1].m_hasNaN =
         local_60.m_data[1].m_hasNaN;
    *(undefined7 *)
     &((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[1].field_0x1 =
         local_60.m_data[1]._1_7_;
    pVVar2->m_data[0].m_hasNaN = local_60.m_data[0].m_hasNaN;
    *(undefined7 *)&pVVar2->m_data[0].field_0x1 = local_60.m_data[0]._1_7_;
    ((Vector<tcu::Vector<tcu::Interval,_2>,_2> *)pVVar2->m_data)->m_data[0].m_data[0].m_lo =
         local_60.m_data[0].m_lo;
    lVar1 = lVar1 + 1;
    pVVar2 = pVVar2 + 1;
  } while (lVar1 == 1);
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}